

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaConfig.cpp
# Opt level: O0

void __thiscall NaConfigPart::NaConfigPart(NaConfigPart *this,NaConfigPart *rCP)

{
  char *__s;
  size_t sVar1;
  void *pvVar2;
  NaConfigPart *in_RSI;
  undefined8 *in_RDI;
  char *szInstance;
  char *szType;
  
  *in_RDI = &PTR__NaConfigPart_00193f10;
  __s = GetType(in_RSI);
  GetInstance(in_RSI);
  sVar1 = strlen(__s);
  pvVar2 = operator_new__(sVar1 + 1);
  in_RDI[1] = pvVar2;
  strcpy((char *)in_RDI[1],__s);
  in_RDI[2] = 0;
  SetInstance(in_RSI,__s);
  in_RDI[3] = 0;
  return;
}

Assistant:

NaConfigPart::NaConfigPart (const NaConfigPart& rCP)
{
    const char  *szType = rCP.GetType();
    const char  *szInstance = rCP.GetInstance();

    szTypeName = new char[strlen(szType) + 1];
    strcpy(szTypeName, szType);

    szInstanceName = NULL;
    SetInstance(szInstance);

    pSelfData = NULL;
}